

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void pile_excise(object **pile,object *obj)

{
  object *poVar1;
  wchar_t line;
  undefined8 in_RCX;
  object *poVar2;
  object *poVar3;
  undefined8 in_RDX;
  object *poVar4;
  object *extraout_RDX;
  object *extraout_RDX_00;
  object *extraout_RDX_01;
  object *extraout_RDX_02;
  object *pile_00;
  bool bVar5;
  bool bVar6;
  
  poVar1 = *pile;
  bVar5 = poVar1 == (object *)0x0;
  bVar6 = !bVar5;
  poVar2 = (object *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
  poVar4 = (object *)CONCAT71((int7)((ulong)in_RDX >> 8),poVar1 == obj || bVar5);
  poVar3 = poVar1;
  if (poVar1 != obj && !bVar5) {
    do {
      poVar2 = poVar3->next;
      bVar6 = poVar2 != (object *)0x0;
      if (poVar2 == obj) break;
      poVar3 = poVar2;
    } while (poVar2 != (object *)0x0);
  }
  line = (wchar_t)poVar2;
  poVar2 = obj->prev;
  poVar3 = obj->next;
  pile_00 = obj;
  if (!bVar6) {
    pile_integrity_fail(poVar1,obj,(char *)0xd7,line);
    poVar4 = extraout_RDX;
  }
  pile_check_integrity((char *)*pile,pile_00,poVar4);
  poVar1 = *pile;
  poVar4 = extraout_RDX_00;
  if (poVar1 == obj) {
    if (poVar2 != (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar1,obj,(char *)0xde,line);
      poVar4 = extraout_RDX_02;
    }
    *pile = poVar3;
  }
  else {
    if (obj->prev == (object *)0x0) {
      pile_00 = obj;
      pile_integrity_fail(poVar1,obj,(char *)0xe4,line);
      poVar4 = extraout_RDX_01;
    }
    poVar2->next = poVar3;
    obj->prev = (object *)0x0;
  }
  if (poVar3 != (object *)0x0) {
    poVar3->prev = poVar2;
    obj->next = (object *)0x0;
  }
  pile_check_integrity((char *)*pile,pile_00,poVar4);
  return;
}

Assistant:

void pile_excise(struct object **pile, struct object *obj)
{
	struct object *prev = obj->prev;
	struct object *next = obj->next;

	if (!pile_contains(*pile, obj)) {
		pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
	}
	pile_check_integrity("excise [pre]", *pile, obj);

	/* Special case: unlink top object */
	if (*pile == obj) {
		if (prev) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		*pile = next;
	} else {
		if (obj->prev == NULL) {
			pile_integrity_fail(*pile, obj, __FILE__, __LINE__);
		}

		/* Otherwise unlink from the previous */
		prev->next = next;
		obj->prev = NULL;
	}

	/* And then unlink from the next */
	if (next) {
		next->prev = prev;
		obj->next = NULL;
	}

	pile_check_integrity("excise [post]", *pile, NULL);
}